

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txorphanage.cpp
# Opt level: O2

vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_> *
__thiscall
TxOrphanage::GetChildrenFromSamePeer
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *__return_storage_ptr__,TxOrphanage *this,CTransactionRef *parent,NodeId nodeid)

{
  element_type *peVar1;
  long lVar2;
  pointer p_Var3;
  const_iterator cVar4;
  _Rb_tree_node_base *p_Var5;
  ulong uVar6;
  __normal_iterator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>
  __first;
  _Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>
  *child_iter;
  pointer p_Var7;
  uint i;
  uint uVar8;
  __normal_iterator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>
  __i;
  long lVar9;
  pointer p_Var10;
  long in_FS_OFFSET;
  vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  iters;
  key_type local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iters.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  iters.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iters.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar8 = 0;
  while( true ) {
    p_Var7 = iters.
             super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    p_Var3 = iters.
             super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar1 = (parent->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((ulong)(((long)(peVar1->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(peVar1->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x28) <= (ulong)uVar8) break;
    local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
    local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)
          ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)
          ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    local_68.n = uVar8;
    cVar4 = std::
            _Rb_tree<COutPoint,_std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>,_std::_Select1st<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
            ::find(&(this->m_outpoint_to_orphan_it)._M_t,&local_68);
    if ((_Rb_tree_header *)cVar4._M_node !=
        &(this->m_outpoint_to_orphan_it)._M_t._M_impl.super__Rb_tree_header) {
      for (p_Var5 = *(_Rb_tree_node_base **)(cVar4._M_node + 3);
          p_Var5 != (_Rb_tree_node_base *)&cVar4._M_node[2]._M_left;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        if (*(long *)(*(long *)(p_Var5 + 1) + 0x50) == nodeid) {
          std::
          vector<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>
          ::
          emplace_back<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>const&>
                    ((vector<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>
                      *)&iters,
                     (_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>
                      *)(p_Var5 + 1));
        }
      }
    }
    uVar8 = uVar8 + 1;
  }
  if (iters.
      super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      iters.
      super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar9 = (long)iters.
                  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)iters.
                  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = lVar9 >> 3;
    lVar2 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>*,std::vector<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<TxOrphanage::GetChildrenFromSamePeer(std::shared_ptr<CTransaction_const>const&,long)const::__0>>
              (iters.
               super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               iters.
               super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar9 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>*,std::vector<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<TxOrphanage::GetChildrenFromSamePeer(std::shared_ptr<CTransaction_const>const&,long)const::__0>>
                (p_Var3,p_Var7);
    }
    else {
      p_Var10 = p_Var3 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>*,std::vector<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<TxOrphanage::GetChildrenFromSamePeer(std::shared_ptr<CTransaction_const>const&,long)const::__0>>
                (p_Var3,p_Var10);
      for (; p_Var10 != p_Var7; p_Var10 = p_Var10 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>*,std::vector<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>>,__gnu_cxx::__ops::_Val_comp_iter<TxOrphanage::GetChildrenFromSamePeer(std::shared_ptr<CTransaction_const>const&,long)const::__0>>
                  (p_Var10);
      }
    }
  }
  __first = std::
            __unique<__gnu_cxx::__normal_iterator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>*,std::vector<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (iters.
                       super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       iters.
                       super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ::erase(&iters,(const_iterator)__first._M_current,
          (const_iterator)
          iters.
          super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish);
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::reserve(__return_storage_ptr__,
            (long)iters.
                  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)iters.
                  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  p_Var3 = iters.
           super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (p_Var7 = iters.
                super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; p_Var7 != p_Var3; p_Var7 = p_Var7 + 1) {
    std::
    vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
    ::emplace_back<std::shared_ptr<CTransaction_const>&>
              ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
                *)__return_storage_ptr__,(shared_ptr<const_CTransaction> *)(p_Var7->_M_node + 2));
  }
  std::
  _Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ::~_Vector_base(&iters.
                   super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                 );
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CTransactionRef> TxOrphanage::GetChildrenFromSamePeer(const CTransactionRef& parent, NodeId nodeid) const
{
    // First construct a vector of iterators to ensure we do not return duplicates of the same tx
    // and so we can sort by nTimeExpire.
    std::vector<OrphanMap::iterator> iters;

    // For each output, get all entries spending this prevout, filtering for ones from the specified peer.
    for (unsigned int i = 0; i < parent->vout.size(); i++) {
        const auto it_by_prev = m_outpoint_to_orphan_it.find(COutPoint(parent->GetHash(), i));
        if (it_by_prev != m_outpoint_to_orphan_it.end()) {
            for (const auto& elem : it_by_prev->second) {
                if (elem->second.fromPeer == nodeid) {
                    iters.emplace_back(elem);
                }
            }
        }
    }

    // Sort by address so that duplicates can be deleted. At the same time, sort so that more recent
    // orphans (which expire later) come first.  Break ties based on address, as nTimeExpire is
    // quantified in seconds and it is possible for orphans to have the same expiry.
    std::sort(iters.begin(), iters.end(), [](const auto& lhs, const auto& rhs) {
        if (lhs->second.nTimeExpire == rhs->second.nTimeExpire) {
            return &(*lhs) < &(*rhs);
        } else {
            return lhs->second.nTimeExpire > rhs->second.nTimeExpire;
        }
    });
    // Erase duplicates
    iters.erase(std::unique(iters.begin(), iters.end()), iters.end());

    // Convert to a vector of CTransactionRef
    std::vector<CTransactionRef> children_found;
    children_found.reserve(iters.size());
    for (const auto& child_iter : iters) {
        children_found.emplace_back(child_iter->second.tx);
    }
    return children_found;
}